

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O1

string * __thiscall
CLI::ConfigBase::to_config
          (string *__return_storage_ptr__,ConfigBase *this,App *app,bool default_also,
          bool write_description,string *prefix)

{
  pointer puVar1;
  Option *this_00;
  size_t __n;
  pointer pcVar2;
  pointer psVar3;
  App *pAVar4;
  App *pAVar5;
  size_type sVar6;
  ConfigBase *pCVar7;
  byte bVar8;
  int iVar9;
  uint uVar10;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  _Var11;
  ostream *poVar12;
  pointer pbVar13;
  long lVar14;
  pointer psVar15;
  __normal_iterator<const_CLI::App_**,_std::vector<const_CLI::App_*,_std::allocator<const_CLI::App_*>_>_>
  _Var16;
  size_t sVar17;
  App *pAVar18;
  undefined8 *puVar19;
  long *plVar20;
  undefined7 in_register_00000009;
  char *pcVar21;
  long *plVar22;
  size_type *psVar23;
  ulong *puVar24;
  App **ppAVar25;
  pointer pbVar26;
  undefined8 uVar27;
  _Alloc_hider _Var28;
  undefined7 in_register_00000081;
  pointer ppAVar29;
  pointer ppAVar30;
  Option_p *opt;
  pointer puVar31;
  string *psVar32;
  undefined1 uVar33;
  bool bVar34;
  string name;
  string single_name;
  string value;
  string commentLead;
  vector<const_CLI::App_*,_std::allocator<const_CLI::App_*>_> subcommands;
  string keyChars;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  groups;
  string commentTest;
  results_t results;
  stringstream out;
  string local_478;
  value_type local_458;
  string local_430;
  uint local_40c;
  ConfigBase *local_408;
  string local_400;
  uint local_3dc;
  uint local_3d8;
  uint local_3d4;
  string local_3d0;
  string local_3b0;
  App *local_390;
  string *local_388;
  vector<const_CLI::App_*,_std::allocator<const_CLI::App_*>_> local_378;
  string local_358;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_338;
  string *local_318;
  App **local_310;
  long *local_308;
  long local_300;
  long local_2f8 [2];
  long *local_2e8;
  long local_2e0;
  long local_2d8;
  undefined4 uStack_2d0;
  undefined4 uStack_2cc;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2c8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_2a8 [2];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_298;
  string local_288;
  string local_268;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_240;
  _Any_data local_218;
  code *local_208;
  undefined8 uStack_200;
  string local_1f8;
  long *local_1d8 [2];
  long local_1c8 [2];
  stringstream local_1b8 [16];
  ostream local_1a8 [112];
  ios_base local_138 [264];
  
  local_40c = (uint)CONCAT71(in_register_00000081,write_description);
  local_3d4 = (uint)CONCAT71(in_register_00000009,default_also);
  local_388 = prefix;
  ::std::__cxx11::stringstream::stringstream(local_1b8);
  local_3d0._M_dataplus._M_p = (pointer)&local_3d0.field_2;
  local_3d0._M_string_length = 0;
  local_3d0.field_2._M_local_buf[0] = '\0';
  ::std::__cxx11::string::push_back((char)&local_3d0);
  ::std::__cxx11::string::push_back((char)&local_3d0);
  local_308 = local_2f8;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_308,"#;","");
  ::std::__cxx11::string::push_back((char)&local_308);
  ::std::__cxx11::string::push_back((char)&local_308);
  local_358._M_dataplus._M_p = (pointer)&local_358.field_2;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&local_358,local_308,local_300 + (long)local_308);
  local_318 = __return_storage_ptr__;
  ::std::__cxx11::string::push_back((char)&local_358);
  ::std::__cxx11::string::push_back((char)&local_358);
  ::std::__cxx11::string::push_back((char)&local_358);
  ::std::__cxx11::string::push_back((char)&local_358);
  ::std::__cxx11::string::push_back((char)&local_358);
  ::std::__cxx11::string::push_back((char)&local_358);
  local_338.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_338.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_338.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  puVar31 = (app->options_).
            super__Vector_base<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  puVar1 = (app->options_).
           super__Vector_base<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (puVar31 != puVar1) {
    do {
      _Var11 = ::std::
               __find_if<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_equals_val<std::__cxx11::string_const>>
                         (local_338.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          local_338.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish,
                          (puVar31->_M_t).
                          super___uniq_ptr_impl<CLI::Option,_std::default_delete<CLI::Option>_>._M_t
                          .super__Tuple_impl<0UL,_CLI::Option_*,_std::default_delete<CLI::Option>_>.
                          super__Head_base<0UL,_CLI::Option_*,_false>._M_head_impl);
      if (_Var11._M_current ==
          local_338.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(&local_338,
                    (value_type *)
                    (puVar31->_M_t).
                    super___uniq_ptr_impl<CLI::Option,_std::default_delete<CLI::Option>_>._M_t.
                    super__Tuple_impl<0UL,_CLI::Option_*,_std::default_delete<CLI::Option>_>.
                    super__Head_base<0UL,_CLI::Option_*,_false>._M_head_impl);
      }
      puVar31 = puVar31 + 1;
    } while (puVar31 != puVar1);
  }
  pbVar26 = local_338.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  local_458._M_dataplus._M_p = (pointer)&local_458.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_458,"OPTIONS","");
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_insert_rval(&local_338,(const_iterator)pbVar26,&local_458);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_458._M_dataplus._M_p != &local_458.field_2) {
    operator_delete(local_458._M_dataplus._M_p,local_458.field_2._M_allocated_capacity + 1);
  }
  local_240 = local_338.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
  local_408 = this;
  local_390 = app;
  if (local_338.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_338.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    uVar10 = 0;
    pbVar26 = local_338.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    do {
      iVar9 = ::std::__cxx11::string::compare((char *)pbVar26);
      if ((iVar9 == 0) || (pbVar26->_M_string_length == 0)) {
        uVar33 = 1;
        if ((uVar10 & 1) == 0) goto LAB_00125d40;
      }
      else {
        uVar33 = (undefined1)uVar10;
LAB_00125d40:
        if ((((char)local_40c != '\0') &&
            (iVar9 = ::std::__cxx11::string::compare((char *)pbVar26), iVar9 != 0)) &&
           (pbVar26->_M_string_length != 0)) {
          local_458._M_dataplus._M_p._0_1_ = 10;
          poVar12 = ::std::__ostream_insert<char,std::char_traits<char>>
                              (local_1a8,(char *)&local_458,1);
          local_458._M_dataplus._M_p._0_1_ = this->commentChar;
          poVar12 = ::std::__ostream_insert<char,std::char_traits<char>>
                              (poVar12,(char *)&local_458,1);
          poVar12 = ::std::__ostream_insert<char,std::char_traits<char>>
                              (poVar12,local_3d0._M_dataplus._M_p,local_3d0._M_string_length);
          poVar12 = ::std::__ostream_insert<char,std::char_traits<char>>
                              (poVar12,(pbVar26->_M_dataplus)._M_p,pbVar26->_M_string_length);
          ::std::__ostream_insert<char,std::char_traits<char>>(poVar12," Options\n",9);
        }
        local_218._M_unused._M_object = (void *)0x0;
        local_218._8_8_ = 0;
        local_208 = (code *)0x0;
        uStack_200 = 0;
        App::get_options((vector<const_CLI::Option_*,_std::allocator<const_CLI::Option_*>_> *)
                         &local_3b0,app,(function<bool_(const_CLI::Option_*)> *)&local_218);
        local_3dc = CONCAT31(local_3dc._1_3_,uVar33);
        if (local_208 != (code *)0x0) {
          (*local_208)(&local_218,&local_218,__destroy_functor);
        }
        local_310 = (App **)local_3b0._M_string_length;
        _Var28._M_p = local_3b0._M_dataplus._M_p;
        if (local_3b0._M_dataplus._M_p != (pointer)local_3b0._M_string_length) {
          do {
            this_00 = *(Option **)_Var28._M_p;
            if (((this_00->super_OptionBase<CLI::Option>).configurable_ == true) &&
               (((__n = (this_00->super_OptionBase<CLI::Option>).group_._M_string_length,
                 __n == pbVar26->_M_string_length &&
                 ((__n == 0 ||
                  (iVar9 = bcmp((this_00->super_OptionBase<CLI::Option>).group_._M_dataplus._M_p,
                                (pbVar26->_M_dataplus)._M_p,__n), iVar9 == 0)))) ||
                ((iVar9 = ::std::__cxx11::string::compare((char *)pbVar26), iVar9 == 0 &&
                 ((this_00->super_OptionBase<CLI::Option>).group_._M_string_length == 0)))))) {
              pbVar13 = (this_00->lnames_).
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              if ((pbVar13 ==
                   (this_00->lnames_).
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish) &&
                 (pbVar13 = (this_00->snames_).
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start,
                 pbVar13 ==
                 (this_00->snames_).
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish)) {
                pbVar13 = (pointer)&(&this_00->pname_)[(this_00->pname_)._M_string_length == 0].
                                    _M_dataplus;
              }
              local_458._M_dataplus._M_p = (pointer)&local_458.field_2;
              pcVar2 = (pbVar13->_M_dataplus)._M_p;
              ::std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_458,pcVar2,pcVar2 + pbVar13->_M_string_length);
              if (local_458._M_string_length == 0) {
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_458._M_dataplus._M_p != &local_458.field_2) goto LAB_001263ea;
              }
              else {
                Option::reduced_results_abi_cxx11_((results_t *)&local_2c8,this_00);
                detail::ini_join(&local_430,
                                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  *)&local_2c8,this->arraySeparator,this->arrayStart,this->arrayEnd,
                                 this->stringQuote,this->literalQuote);
                bVar8 = (char *)local_430._M_string_length == (char *)0x0 & (byte)local_3d4;
                local_3d8 = CONCAT31(local_3d8._1_3_,bVar8);
                if (bVar8 == 1) {
                  pcVar2 = (this_00->default_str_)._M_dataplus._M_p;
                  local_478._M_dataplus._M_p = (pointer)&local_478.field_2;
                  ::std::__cxx11::string::_M_construct<char*>
                            ((string *)&local_478,pcVar2,
                             pcVar2 + (this_00->default_str_)._M_string_length);
                  sVar6 = local_478._M_string_length;
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_478._M_dataplus._M_p != &local_478.field_2) {
                    operator_delete(local_478._M_dataplus._M_p,
                                    local_478.field_2._M_allocated_capacity + 1);
                  }
                  if (sVar6 == 0) {
                    if (this_00->expected_min_ == 0) {
                      pcVar21 = "false";
                    }
                    else {
                      pcVar21 = "\"\"";
                      if ((this_00->run_callback_for_default_ == false) &&
                         (pcVar21 = "\"\"",
                         (this_00->super_OptionBase<CLI::Option>).required_ != false)) {
                        pcVar21 = "\"<REQUIRED>\"";
                      }
                    }
                    ::std::__cxx11::string::_M_replace
                              ((ulong)&local_430,0,(char *)local_430._M_string_length,(ulong)pcVar21
                              );
                  }
                  else {
                    local_400._M_dataplus._M_p = (pointer)&local_400.field_2;
                    pcVar2 = (this_00->default_str_)._M_dataplus._M_p;
                    ::std::__cxx11::string::_M_construct<char*>
                              ((string *)&local_400,pcVar2,
                               pcVar2 + (this_00->default_str_)._M_string_length);
                    detail::convert_arg_for_ini
                              (&local_478,&local_400,local_408->stringQuote,local_408->literalQuote,
                               false);
                    ::std::__cxx11::string::operator=((string *)&local_430,(string *)&local_478);
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_478._M_dataplus._M_p != &local_478.field_2) {
                      operator_delete(local_478._M_dataplus._M_p,
                                      local_478.field_2._M_allocated_capacity + 1);
                    }
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_400._M_dataplus._M_p != &local_400.field_2) {
                      operator_delete(local_400._M_dataplus._M_p,
                                      local_400.field_2._M_allocated_capacity + 1);
                    }
                  }
                }
                if ((char *)local_430._M_string_length != (char *)0x0) {
                  if ((this_00->fnames_).
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start !=
                      (this_00->fnames_).
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish) {
                    local_268._M_dataplus._M_p = (pointer)&local_268.field_2;
                    ::std::__cxx11::string::_M_construct<char*>
                              ((string *)&local_268,local_430._M_dataplus._M_p,
                               (char *)(local_430._M_string_length +
                                       (long)local_430._M_dataplus._M_p));
                    Option::get_flag_value(&local_478,this_00,&local_458,&local_268);
                    ::std::__cxx11::string::operator=((string *)&local_430,(string *)&local_478);
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_478._M_dataplus._M_p != &local_478.field_2) {
                      operator_delete(local_478._M_dataplus._M_p,
                                      local_478.field_2._M_allocated_capacity + 1);
                    }
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_268._M_dataplus._M_p != &local_268.field_2) {
                      operator_delete(local_268._M_dataplus._M_p,
                                      local_268.field_2._M_allocated_capacity + 1);
                    }
                  }
                  if (((char)local_40c != '\0') && ((this_00->description_)._M_string_length != 0))
                  {
                    lVar14 = ::std::ostream::tellp();
                    if (lVar14 != 0) {
                      local_478._M_dataplus._M_p._0_1_ = 10;
                      ::std::__ostream_insert<char,std::char_traits<char>>
                                (local_1a8,(char *)&local_478,1);
                    }
                    poVar12 = ::std::__ostream_insert<char,std::char_traits<char>>
                                        (local_1a8,local_3d0._M_dataplus._M_p,
                                         local_3d0._M_string_length);
                    local_288._M_dataplus._M_p = (pointer)&local_288.field_2;
                    pcVar2 = (this_00->description_)._M_dataplus._M_p;
                    ::std::__cxx11::string::_M_construct<char*>
                              ((string *)&local_288,pcVar2,
                               pcVar2 + (this_00->description_)._M_string_length);
                    detail::fix_newlines(&local_478,&local_3d0,&local_288);
                    poVar12 = ::std::__ostream_insert<char,std::char_traits<char>>
                                        (poVar12,local_478._M_dataplus._M_p,
                                         local_478._M_string_length);
                    local_400._M_dataplus._M_p._0_1_ = 10;
                    ::std::__ostream_insert<char,std::char_traits<char>>
                              (poVar12,(char *)&local_400,1);
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_478._M_dataplus._M_p != &local_478.field_2) {
                      operator_delete(local_478._M_dataplus._M_p,
                                      local_478.field_2._M_allocated_capacity + 1);
                    }
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_288._M_dataplus._M_p != &local_288.field_2) {
                      operator_delete(local_288._M_dataplus._M_p,
                                      local_288.field_2._M_allocated_capacity + 1);
                    }
                  }
                  clean_name_string(&local_458,&local_358);
                  ::std::operator+(&local_478,local_388,&local_458);
                  pCVar7 = local_408;
                  if (((byte)local_3d8 & local_408->commentDefaultsBool) == 1) {
                    ::std::operator+(&local_400,local_408->commentChar,&local_478);
                    ::std::__cxx11::string::operator=((string *)&local_478,(string *)&local_400);
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_400._M_dataplus._M_p != &local_400.field_2) {
                      operator_delete(local_400._M_dataplus._M_p,
                                      local_400.field_2._M_allocated_capacity + 1);
                    }
                  }
                  poVar12 = ::std::__ostream_insert<char,std::char_traits<char>>
                                      (local_1a8,local_478._M_dataplus._M_p,
                                       local_478._M_string_length);
                  local_400._M_dataplus._M_p._0_1_ = pCVar7->valueDelimiter;
                  poVar12 = ::std::__ostream_insert<char,std::char_traits<char>>
                                      (poVar12,(char *)&local_400,1);
                  poVar12 = ::std::__ostream_insert<char,std::char_traits<char>>
                                      (poVar12,local_430._M_dataplus._M_p,local_430._M_string_length
                                      );
                  local_400._M_dataplus._M_p._0_1_ = 10;
                  ::std::__ostream_insert<char,std::char_traits<char>>(poVar12,(char *)&local_400,1)
                  ;
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_478._M_dataplus._M_p != &local_478.field_2) {
                    operator_delete(local_478._M_dataplus._M_p,
                                    local_478.field_2._M_allocated_capacity + 1);
                  }
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_430._M_dataplus._M_p != &local_430.field_2) {
                  operator_delete(local_430._M_dataplus._M_p,
                                  local_430.field_2._M_allocated_capacity + 1);
                }
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)&local_2c8);
                this = local_408;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_458._M_dataplus._M_p != &local_458.field_2) {
LAB_001263ea:
                  operator_delete(local_458._M_dataplus._M_p,
                                  local_458.field_2._M_allocated_capacity + 1);
                }
              }
            }
            _Var28._M_p = _Var28._M_p + 8;
          } while ((App **)_Var28._M_p != local_310);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_3b0._M_dataplus._M_p !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)0x0) {
          operator_delete(local_3b0._M_dataplus._M_p,
                          local_3b0.field_2._M_allocated_capacity - (long)local_3b0._M_dataplus._M_p
                         );
        }
        uVar10 = local_3dc & 0xff;
        app = local_390;
      }
      pbVar26 = pbVar26 + 1;
    } while (pbVar26 != local_240);
  }
  local_458.field_2._M_allocated_capacity = 0;
  local_458.field_2._8_8_ = 0;
  local_458._M_dataplus._M_p = (pointer)0x0;
  local_458._M_string_length = 0;
  std::vector<const_CLI::App_*,_std::allocator<const_CLI::App_*>_>::vector
            (&local_378,
             (long)(app->subcommands_).
                   super__Vector_base<std::shared_ptr<CLI::App>,_std::allocator<std::shared_ptr<CLI::App>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)(app->subcommands_).
                   super__Vector_base<std::shared_ptr<CLI::App>,_std::allocator<std::shared_ptr<CLI::App>_>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 4,(allocator_type *)&local_430);
  psVar3 = (app->subcommands_).
           super__Vector_base<std::shared_ptr<CLI::App>,_std::allocator<std::shared_ptr<CLI::App>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  ppAVar25 = local_378.super__Vector_base<const_CLI::App_*,_std::allocator<const_CLI::App_*>_>.
             _M_impl.super__Vector_impl_data._M_start;
  for (psVar15 = (app->subcommands_).
                 super__Vector_base<std::shared_ptr<CLI::App>,_std::allocator<std::shared_ptr<CLI::App>_>_>
                 ._M_impl.super__Vector_impl_data._M_start; psVar15 != psVar3; psVar15 = psVar15 + 1
      ) {
    *ppAVar25 = (psVar15->super___shared_ptr<CLI::App,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    ppAVar25 = ppAVar25 + 1;
  }
  if (((code *)local_458.field_2._M_allocated_capacity != (code *)0x0) &&
     (_Var16 = ::std::
               __remove_if<__gnu_cxx::__normal_iterator<CLI::App_const**,std::vector<CLI::App_const*,std::allocator<CLI::App_const*>>>,__gnu_cxx::__ops::_Iter_pred<CLI::App::get_subcommands(std::function<bool(CLI::App_const*)>const&)const::_lambda(CLI::App_const*)_1_>>
                         ((__normal_iterator<const_CLI::App_**,_std::vector<const_CLI::App_*,_std::allocator<const_CLI::App_*>_>_>
                           )local_378.
                            super__Vector_base<const_CLI::App_*,_std::allocator<const_CLI::App_*>_>.
                            _M_impl.super__Vector_impl_data._M_start,
                          (__normal_iterator<const_CLI::App_**,_std::vector<const_CLI::App_*,_std::allocator<const_CLI::App_*>_>_>
                           )local_378.
                            super__Vector_base<const_CLI::App_*,_std::allocator<const_CLI::App_*>_>.
                            _M_impl.super__Vector_impl_data._M_finish,
                          (_Iter_pred<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_LLNL[P]units_ThirdParty_CLI11_hpp:8793:39)>
                           )&local_458),
     _Var16._M_current !=
     local_378.super__Vector_base<const_CLI::App_*,_std::allocator<const_CLI::App_*>_>._M_impl.
     super__Vector_impl_data._M_finish)) {
    local_378.super__Vector_base<const_CLI::App_*,_std::allocator<const_CLI::App_*>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)_Var16;
  }
  if ((code *)local_458.field_2._M_allocated_capacity != (code *)0x0) {
    (*(code *)local_458.field_2._M_allocated_capacity)(&local_458,&local_458,3);
  }
  ppAVar30 = local_378.super__Vector_base<const_CLI::App_*,_std::allocator<const_CLI::App_*>_>.
             _M_impl.super__Vector_impl_data._M_finish;
  local_3d8 = local_3d4 & 0xff;
  local_3dc = local_40c & 0xff;
  if (local_378.super__Vector_base<const_CLI::App_*,_std::allocator<const_CLI::App_*>_>._M_impl.
      super__Vector_impl_data._M_start !=
      local_378.super__Vector_base<const_CLI::App_*,_std::allocator<const_CLI::App_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    ppAVar29 = local_378.super__Vector_base<const_CLI::App_*,_std::allocator<const_CLI::App_*>_>.
               _M_impl.super__Vector_impl_data._M_start;
    do {
      pAVar4 = *ppAVar29;
      if (((pAVar4->name_)._M_string_length == 0) &&
         (((byte)local_3d4 != '\0' || (sVar17 = App::count_all(pAVar4), sVar17 != 0)))) {
        if (((char)local_40c != '\0') && ((pAVar4->group_)._M_string_length != 0)) {
          local_458._M_dataplus._M_p._0_1_ = 10;
          poVar12 = ::std::__ostream_insert<char,std::char_traits<char>>
                              (local_1a8,(char *)&local_458,1);
          poVar12 = ::std::__ostream_insert<char,std::char_traits<char>>
                              (poVar12,local_3d0._M_dataplus._M_p,local_3d0._M_string_length);
          poVar12 = ::std::__ostream_insert<char,std::char_traits<char>>
                              (poVar12,(pAVar4->group_)._M_dataplus._M_p,
                               (pAVar4->group_)._M_string_length);
          ::std::__ostream_insert<char,std::char_traits<char>>(poVar12," Options\n",9);
        }
        pcVar2 = (local_388->_M_dataplus)._M_p;
        local_1d8[0] = local_1c8;
        ::std::__cxx11::string::_M_construct<char*>
                  ((string *)local_1d8,pcVar2,pcVar2 + local_388->_M_string_length);
        (**(local_408->super_Config)._vptr_Config)
                  (&local_458,local_408,pAVar4,(ulong)local_3d8,(ulong)local_3dc,(string *)local_1d8
                  );
        ::std::__ostream_insert<char,std::char_traits<char>>
                  (local_1a8,local_458._M_dataplus._M_p,local_458._M_string_length);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_458._M_dataplus._M_p != &local_458.field_2) {
          operator_delete(local_458._M_dataplus._M_p,
                          (ulong)(local_458.field_2._M_allocated_capacity + 1));
        }
        if (local_1d8[0] != local_1c8) {
          operator_delete(local_1d8[0],local_1c8[0] + 1);
        }
      }
      ppAVar29 = ppAVar29 + 1;
    } while (ppAVar29 != ppAVar30);
  }
  local_310 = local_378.super__Vector_base<const_CLI::App_*,_std::allocator<const_CLI::App_*>_>.
              _M_impl.super__Vector_impl_data._M_finish;
  if (local_378.super__Vector_base<const_CLI::App_*,_std::allocator<const_CLI::App_*>_>._M_impl.
      super__Vector_impl_data._M_start !=
      local_378.super__Vector_base<const_CLI::App_*,_std::allocator<const_CLI::App_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    ppAVar30 = local_378.super__Vector_base<const_CLI::App_*,_std::allocator<const_CLI::App_*>_>.
               _M_impl.super__Vector_impl_data._M_start;
    do {
      pAVar4 = *ppAVar30;
      if (((pAVar4->name_)._M_string_length != 0) &&
         (((byte)local_3d4 != '\0' || (sVar17 = App::count_all(pAVar4), sVar17 != 0)))) {
        pcVar2 = (pAVar4->name_)._M_dataplus._M_p;
        local_458._M_dataplus._M_p = (pointer)&local_458.field_2;
        ::std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_458,pcVar2,pcVar2 + (pAVar4->name_)._M_string_length);
        clean_name_string(&local_458,&local_358);
        if ((pAVar4->configurable_ == true) &&
           (((byte)local_3d4 != '\0' ||
            (pAVar18 = App::get_subcommand(local_390,pAVar4), pAVar18->parsed_ != 0)))) {
          if ((local_388->_M_string_length == 0) && (local_390->parent_ != (App *)0x0)) {
            local_430._M_dataplus._M_p = (pointer)&local_430.field_2;
            pcVar2 = (local_390->name_)._M_dataplus._M_p;
            ::std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_430,pcVar2,pcVar2 + (local_390->name_)._M_string_length);
            clean_name_string(&local_430,&local_358);
            local_400._M_dataplus._M_p = (pointer)&local_400.field_2;
            ::std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_400,local_430._M_dataplus._M_p,
                       (char *)(local_430._M_string_length + (long)local_430._M_dataplus._M_p));
            ::std::__cxx11::string::_M_replace_aux
                      ((ulong)&local_400,local_400._M_string_length,0,'\x01');
            plVar20 = (long *)::std::__cxx11::string::_M_append
                                        ((char *)&local_400,(ulong)local_458._M_dataplus._M_p);
            psVar23 = (size_type *)(plVar20 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar20 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)psVar23) {
              local_478.field_2._M_allocated_capacity = *psVar23;
              local_478.field_2._8_8_ = plVar20[3];
              local_478._M_dataplus._M_p = (pointer)&local_478.field_2;
            }
            else {
              local_478.field_2._M_allocated_capacity = *psVar23;
              local_478._M_dataplus._M_p = (pointer)*plVar20;
            }
            local_478._M_string_length = plVar20[1];
            *plVar20 = (long)psVar23;
            plVar20[1] = 0;
            *(undefined1 *)(plVar20 + 2) = 0;
            ::std::__cxx11::string::operator=((string *)&local_458,(string *)&local_478);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_478._M_dataplus._M_p != &local_478.field_2) {
              operator_delete(local_478._M_dataplus._M_p,local_478.field_2._M_allocated_capacity + 1
                             );
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_400._M_dataplus._M_p != &local_400.field_2) {
              operator_delete(local_400._M_dataplus._M_p,local_400.field_2._M_allocated_capacity + 1
                             );
            }
            pAVar18 = local_390->parent_;
            pAVar5 = pAVar18->parent_;
            while (pAVar5 != (App *)0x0) {
              local_478._M_dataplus._M_p = (pointer)&local_478.field_2;
              pcVar2 = (pAVar18->name_)._M_dataplus._M_p;
              ::std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_478,pcVar2,pcVar2 + (pAVar18->name_)._M_string_length);
              clean_name_string(&local_478,&local_358);
              local_3b0._M_dataplus._M_p = (pointer)&local_3b0.field_2;
              ::std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_3b0,local_478._M_dataplus._M_p,
                         local_478._M_dataplus._M_p + local_478._M_string_length);
              ::std::__cxx11::string::_M_replace_aux
                        ((ulong)&local_3b0,local_3b0._M_string_length,0,'\x01');
              plVar20 = (long *)::std::__cxx11::string::_M_append
                                          ((char *)&local_3b0,(ulong)local_458._M_dataplus._M_p);
              puVar24 = (ulong *)(plVar20 + 2);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*plVar20 ==
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)puVar24) {
                local_400.field_2._M_allocated_capacity = *puVar24;
                local_400.field_2._8_8_ = plVar20[3];
                local_400._M_dataplus._M_p = (pointer)&local_400.field_2;
              }
              else {
                local_400.field_2._M_allocated_capacity = *puVar24;
                local_400._M_dataplus._M_p = (pointer)*plVar20;
              }
              local_400._M_string_length = plVar20[1];
              *plVar20 = (long)puVar24;
              plVar20[1] = 0;
              *(undefined1 *)(plVar20 + 2) = 0;
              ::std::__cxx11::string::operator=((string *)&local_458,(string *)&local_400);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_400._M_dataplus._M_p != &local_400.field_2) {
                operator_delete(local_400._M_dataplus._M_p,
                                local_400.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_3b0._M_dataplus._M_p != &local_3b0.field_2) {
                operator_delete(local_3b0._M_dataplus._M_p,
                                local_3b0.field_2._M_allocated_capacity + 1);
              }
              pAVar18 = pAVar18->parent_;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_478._M_dataplus._M_p != &local_478.field_2) {
                operator_delete(local_478._M_dataplus._M_p,
                                local_478.field_2._M_allocated_capacity + 1);
              }
              pAVar5 = pAVar18->parent_;
            }
            local_478._M_dataplus._M_p._1_7_ = (undefined7)((ulong)local_478._M_dataplus._M_p >> 8);
            local_478._M_dataplus._M_p._0_1_ = 0x5b;
            poVar12 = ::std::__ostream_insert<char,std::char_traits<char>>
                                (local_1a8,(char *)&local_478,1);
            poVar12 = ::std::__ostream_insert<char,std::char_traits<char>>
                                (poVar12,local_458._M_dataplus._M_p,local_458._M_string_length);
            ::std::__ostream_insert<char,std::char_traits<char>>(poVar12,"]\n",2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_430._M_dataplus._M_p != &local_430.field_2) {
              operator_delete(local_430._M_dataplus._M_p,local_430.field_2._M_allocated_capacity + 1
                             );
            }
          }
          else {
            local_430._M_dataplus._M_p._0_1_ = 0x5b;
            poVar12 = ::std::__ostream_insert<char,std::char_traits<char>>
                                (local_1a8,(char *)&local_430,1);
            poVar12 = ::std::__ostream_insert<char,std::char_traits<char>>
                                (poVar12,(local_388->_M_dataplus)._M_p,local_388->_M_string_length);
            poVar12 = ::std::__ostream_insert<char,std::char_traits<char>>
                                (poVar12,local_458._M_dataplus._M_p,local_458._M_string_length);
            ::std::__ostream_insert<char,std::char_traits<char>>(poVar12,"]\n",2);
          }
          local_2a8[0] = &local_298;
          ::std::__cxx11::string::_M_construct<char_const*>((string *)local_2a8,"");
          (**(local_408->super_Config)._vptr_Config)
                    (&local_430,local_408,pAVar4,(ulong)local_3d8,(ulong)local_3dc,
                     (string *)local_2a8);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    (local_1a8,local_430._M_dataplus._M_p,local_430._M_string_length);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_430._M_dataplus._M_p != &local_430.field_2) {
            operator_delete(local_430._M_dataplus._M_p,local_430.field_2._M_allocated_capacity + 1);
          }
          uVar27 = local_298._M_allocated_capacity;
          _Var28._M_p = (pointer)local_2a8[0];
          if (local_2a8[0] != &local_298) {
LAB_00126b8a:
            operator_delete(_Var28._M_p,uVar27 + 1);
          }
        }
        else {
          ::std::operator+(&local_478,local_388,&local_458);
          plVar20 = (long *)::std::__cxx11::string::_M_replace_aux
                                      ((ulong)&local_478,local_478._M_string_length,0,'\x01');
          local_2e8 = &local_2d8;
          plVar22 = plVar20 + 2;
          if ((long *)*plVar20 == plVar22) {
            local_2d8 = *plVar22;
            uStack_2d0 = (undefined4)plVar20[3];
            uStack_2cc = *(undefined4 *)((long)plVar20 + 0x1c);
          }
          else {
            local_2d8 = *plVar22;
            local_2e8 = (long *)*plVar20;
          }
          local_2e0 = plVar20[1];
          *plVar20 = (long)plVar22;
          plVar20[1] = 0;
          *(undefined1 *)(plVar20 + 2) = 0;
          (**(local_408->super_Config)._vptr_Config)
                    (&local_430,local_408,pAVar4,(ulong)local_3d8,(ulong)local_3dc,&local_2e8);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    (local_1a8,local_430._M_dataplus._M_p,local_430._M_string_length);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_430._M_dataplus._M_p != &local_430.field_2) {
            operator_delete(local_430._M_dataplus._M_p,local_430.field_2._M_allocated_capacity + 1);
          }
          if (local_2e8 != &local_2d8) {
            operator_delete(local_2e8,local_2d8 + 1);
          }
          uVar27 = local_478.field_2._M_allocated_capacity;
          _Var28._M_p = local_478._M_dataplus._M_p;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_478._M_dataplus._M_p != &local_478.field_2) goto LAB_00126b8a;
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_458._M_dataplus._M_p != &local_458.field_2) {
          operator_delete(local_458._M_dataplus._M_p,
                          (ulong)(local_458.field_2._M_allocated_capacity + 1));
        }
      }
      ppAVar30 = ppAVar30 + 1;
    } while (ppAVar30 != local_310);
  }
  if ((char)local_40c == '\0') {
    bVar34 = false;
  }
  else {
    ::std::__cxx11::stringbuf::str();
    bVar34 = local_458._M_string_length != 0;
  }
  psVar32 = local_318;
  pCVar7 = local_408;
  if (((char)local_40c != '\0') &&
     ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_458._M_dataplus._M_p != &local_458.field_2)) {
    operator_delete(local_458._M_dataplus._M_p,(ulong)(local_458.field_2._M_allocated_capacity + 1))
    ;
  }
  if (!bVar34) {
    ::std::__cxx11::stringbuf::str();
    goto LAB_0012726d;
  }
  ::std::operator+(&local_400,pCVar7->commentChar,&local_3d0);
  ::std::operator+(&local_2c8,pCVar7->commentChar,&local_3d0);
  pcVar2 = (local_390->description_)._M_dataplus._M_p;
  local_1f8._M_dataplus._M_p = (pointer)&local_1f8.field_2;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&local_1f8,pcVar2,pcVar2 + (local_390->description_)._M_string_length);
  detail::fix_newlines(&local_3b0,&local_2c8,&local_1f8);
  uVar27 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_400._M_dataplus._M_p != &local_400.field_2) {
    uVar27 = local_400.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar27 < local_3b0._M_string_length + local_400._M_string_length) {
    uVar27 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3b0._M_dataplus._M_p != &local_3b0.field_2) {
      uVar27 = local_3b0.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar27 < local_3b0._M_string_length + local_400._M_string_length) goto LAB_00127041;
    puVar19 = (undefined8 *)
              ::std::__cxx11::string::replace
                        ((ulong)&local_3b0,0,(char *)0x0,(ulong)local_400._M_dataplus._M_p);
  }
  else {
LAB_00127041:
    puVar19 = (undefined8 *)
              ::std::__cxx11::string::_M_append
                        ((char *)&local_400,(ulong)local_3b0._M_dataplus._M_p);
  }
  local_478._M_dataplus._M_p = (pointer)&local_478.field_2;
  psVar23 = puVar19 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar19 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar23) {
    local_478.field_2._M_allocated_capacity = *psVar23;
    local_478.field_2._8_8_ = puVar19[3];
  }
  else {
    local_478.field_2._M_allocated_capacity = *psVar23;
    local_478._M_dataplus._M_p = (pointer)*puVar19;
  }
  local_478._M_string_length = puVar19[1];
  *puVar19 = psVar23;
  puVar19[1] = 0;
  *(undefined1 *)psVar23 = 0;
  plVar20 = (long *)::std::__cxx11::string::_M_replace_aux
                              ((ulong)&local_478,local_478._M_string_length,0,'\x01');
  psVar23 = (size_type *)(plVar20 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar20 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar23) {
    local_430.field_2._M_allocated_capacity = *psVar23;
    local_430.field_2._8_8_ = plVar20[3];
    local_430._M_dataplus._M_p = (pointer)&local_430.field_2;
  }
  else {
    local_430.field_2._M_allocated_capacity = *psVar23;
    local_430._M_dataplus._M_p = (pointer)*plVar20;
  }
  local_430._M_string_length = plVar20[1];
  *plVar20 = (long)psVar23;
  plVar20[1] = 0;
  *(undefined1 *)(plVar20 + 2) = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_478._M_dataplus._M_p != &local_478.field_2) {
    operator_delete(local_478._M_dataplus._M_p,local_478.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3b0._M_dataplus._M_p != &local_3b0.field_2) {
    operator_delete(local_3b0._M_dataplus._M_p,local_3b0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
    operator_delete(local_1f8._M_dataplus._M_p,local_1f8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2c8._M_dataplus._M_p != &local_2c8.field_2) {
    operator_delete(local_2c8._M_dataplus._M_p,local_2c8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_400._M_dataplus._M_p != &local_400.field_2) {
    operator_delete(local_400._M_dataplus._M_p,local_400.field_2._M_allocated_capacity + 1);
  }
  ::std::__cxx11::stringbuf::str();
  psVar32 = local_318;
  plVar20 = (long *)::std::__cxx11::string::replace
                              ((ulong)&local_478,0,(char *)0x0,(ulong)local_430._M_dataplus._M_p);
  (psVar32->_M_dataplus)._M_p = (pointer)&psVar32->field_2;
  psVar23 = (size_type *)(plVar20 + 2);
  if ((size_type *)*plVar20 == psVar23) {
    lVar14 = plVar20[3];
    (psVar32->field_2)._M_allocated_capacity = *psVar23;
    *(long *)((long)&psVar32->field_2 + 8) = lVar14;
  }
  else {
    (psVar32->_M_dataplus)._M_p = (pointer)*plVar20;
    (psVar32->field_2)._M_allocated_capacity = *psVar23;
  }
  psVar32->_M_string_length = plVar20[1];
  *plVar20 = (long)psVar23;
  plVar20[1] = 0;
  *(undefined1 *)(plVar20 + 2) = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_478._M_dataplus._M_p != &local_478.field_2) {
    operator_delete(local_478._M_dataplus._M_p,local_478.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_430._M_dataplus._M_p != &local_430.field_2) {
    operator_delete(local_430._M_dataplus._M_p,local_430.field_2._M_allocated_capacity + 1);
  }
LAB_0012726d:
  if (local_378.super__Vector_base<const_CLI::App_*,_std::allocator<const_CLI::App_*>_>._M_impl.
      super__Vector_impl_data._M_start != (App **)0x0) {
    operator_delete(local_378.
                    super__Vector_base<const_CLI::App_*,_std::allocator<const_CLI::App_*>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_378.
                          super__Vector_base<const_CLI::App_*,_std::allocator<const_CLI::App_*>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_378.
                          super__Vector_base<const_CLI::App_*,_std::allocator<const_CLI::App_*>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_338);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_358._M_dataplus._M_p != &local_358.field_2) {
    operator_delete(local_358._M_dataplus._M_p,local_358.field_2._M_allocated_capacity + 1);
  }
  if (local_308 != local_2f8) {
    operator_delete(local_308,local_2f8[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3d0._M_dataplus._M_p != &local_3d0.field_2) {
    operator_delete(local_3d0._M_dataplus._M_p,
                    CONCAT71(local_3d0.field_2._M_allocated_capacity._1_7_,
                             local_3d0.field_2._M_local_buf[0]) + 1);
  }
  ::std::__cxx11::stringstream::~stringstream(local_1b8);
  ::std::ios_base::~ios_base(local_138);
  return psVar32;
}

Assistant:

CLI11_INLINE std::string
ConfigBase::to_config(const App *app, bool default_also, bool write_description, std::string prefix) const {
    std::stringstream out;
    std::string commentLead;
    commentLead.push_back(commentChar);
    commentLead.push_back(' ');

    std::string commentTest = "#;";
    commentTest.push_back(commentChar);
    commentTest.push_back(parentSeparatorChar);

    std::string keyChars = commentTest;
    keyChars.push_back(literalQuote);
    keyChars.push_back(stringQuote);
    keyChars.push_back(arrayStart);
    keyChars.push_back(arrayEnd);
    keyChars.push_back(valueDelimiter);
    keyChars.push_back(arraySeparator);

    std::vector<std::string> groups = app->get_groups();
    bool defaultUsed = false;
    groups.insert(groups.begin(), std::string("OPTIONS"));

    for(auto &group : groups) {
        if(group == "OPTIONS" || group.empty()) {
            if(defaultUsed) {
                continue;
            }
            defaultUsed = true;
        }
        if(write_description && group != "OPTIONS" && !group.empty()) {
            out << '\n' << commentChar << commentLead << group << " Options\n";
        }
        for(const Option *opt : app->get_options({})) {
            // Only process options that are configurable
            if(opt->get_configurable()) {
                if(opt->get_group() != group) {
                    if(!(group == "OPTIONS" && opt->get_group().empty())) {
                        continue;
                    }
                }
                std::string single_name = opt->get_single_name();
                if(single_name.empty()) {
                    continue;
                }

                auto results = opt->reduced_results();
                std::string value =
                    detail::ini_join(results, arraySeparator, arrayStart, arrayEnd, stringQuote, literalQuote);

                bool isDefault = false;
                if(value.empty() && default_also) {
                    if(!opt->get_default_str().empty()) {
                        value = detail::convert_arg_for_ini(opt->get_default_str(), stringQuote, literalQuote, false);
                    } else if(opt->get_expected_min() == 0) {
                        value = "false";
                    } else if(opt->get_run_callback_for_default() || !opt->get_required()) {
                        value = "\"\"";  // empty string default value
                    } else {
                        value = "\"<REQUIRED>\"";
                    }
                    isDefault = true;
                }

                if(!value.empty()) {
                    if(!opt->get_fnames().empty()) {
                        try {
                            value = opt->get_flag_value(single_name, value);
                        } catch(const CLI::ArgumentMismatch &) {
                            bool valid{false};
                            for(const auto &test_name : opt->get_fnames()) {
                                try {
                                    value = opt->get_flag_value(test_name, value);
                                    single_name = test_name;
                                    valid = true;
                                } catch(const CLI::ArgumentMismatch &) {
                                    continue;
                                }
                            }
                            if(!valid) {
                                value = detail::ini_join(
                                    opt->results(), arraySeparator, arrayStart, arrayEnd, stringQuote, literalQuote);
                            }
                        }
                    }
                    if(write_description && opt->has_description()) {
                        if(out.tellp() != std::streampos(0)) {
                            out << '\n';
                        }
                        out << commentLead << detail::fix_newlines(commentLead, opt->get_description()) << '\n';
                    }
                    clean_name_string(single_name, keyChars);

                    std::string name = prefix + single_name;
                    if(commentDefaultsBool && isDefault) {
                        name = commentChar + name;
                    }
                    out << name << valueDelimiter << value << '\n';
                }
            }
        }
    }

    auto subcommands = app->get_subcommands({});
    for(const App *subcom : subcommands) {
        if(subcom->get_name().empty()) {
            if(!default_also && (subcom->count_all() == 0)) {
                continue;
            }
            if(write_description && !subcom->get_group().empty()) {
                out << '\n' << commentLead << subcom->get_group() << " Options\n";
            }
            /*if (!prefix.empty() || app->get_parent() == nullptr) {
                out << '[' << prefix << "___"<< subcom->get_group() << "]\n";
            } else {
                std::string subname = app->get_name() + parentSeparatorChar + "___"+subcom->get_group();
                const auto *p = app->get_parent();
                while(p->get_parent() != nullptr) {
                    subname = p->get_name() + parentSeparatorChar +subname;
                    p = p->get_parent();
                }
                out << '[' << subname << "]\n";
            }
            */
            out << to_config(subcom, default_also, write_description, prefix);
        }
    }

    for(const App *subcom : subcommands) {
        if(!subcom->get_name().empty()) {
            if(!default_also && (subcom->count_all() == 0)) {
                continue;
            }
            std::string subname = subcom->get_name();
            clean_name_string(subname, keyChars);

            if(subcom->get_configurable() && (default_also || app->got_subcommand(subcom))) {
                if(!prefix.empty() || app->get_parent() == nullptr) {

                    out << '[' << prefix << subname << "]\n";
                } else {
                    std::string appname = app->get_name();
                    clean_name_string(appname, keyChars);
                    subname = appname + parentSeparatorChar + subname;
                    const auto *p = app->get_parent();
                    while(p->get_parent() != nullptr) {
                        std::string pname = p->get_name();
                        clean_name_string(pname, keyChars);
                        subname = pname + parentSeparatorChar + subname;
                        p = p->get_parent();
                    }
                    out << '[' << subname << "]\n";
                }
                out << to_config(subcom, default_also, write_description, "");
            } else {
                out << to_config(subcom, default_also, write_description, prefix + subname + parentSeparatorChar);
            }
        }
    }

    if(write_description && !out.str().empty()) {
        std::string outString =
            commentChar + commentLead + detail::fix_newlines(commentChar + commentLead, app->get_description()) + '\n';
        return outString + out.str();
    }
    return out.str();
}